

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Dummy(ImVec2 *size)

{
  ImVec2 *lhs;
  ImVec2 local_30;
  undefined1 local_28 [8];
  ImRect bb;
  ImGuiWindow *window;
  ImVec2 *size_local;
  
  bb.Max = (ImVec2)GetCurrentWindow();
  if ((*(bool *)((long)bb.Max + 0x8c) & 1U) == 0) {
    lhs = (ImVec2 *)((long)bb.Max + 0xc0);
    local_30 = ::operator+(lhs,size);
    ImRect::ImRect((ImRect *)local_28,lhs,&local_30);
    ItemSize((ImRect *)local_28,0.0);
    ItemAdd((ImRect *)local_28,(ImGuiID *)0x0);
  }
  return;
}

Assistant:

void ImGui::Dummy(const ImVec2& size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(bb);
    ItemAdd(bb, NULL);
}